

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater.cpp
# Opt level: O0

void __thiscall
hiberlite::UpdateBean::commitRow(UpdateBean *this,shared_connection *con,sqlid_t rowid)

{
  value_type paVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  RowScope *pRVar5;
  runtime_error *this_00;
  autoclosed_con *this_01;
  sqlite3 *db_00;
  char *zSql;
  statement_ptr *psVar6;
  size_type sVar7;
  reference ppaVar8;
  sqlite3_stmt *psVar9;
  size_type sVar10;
  logic_error *this_02;
  shared_res<hiberlite::autoclosed_con> local_158;
  int local_144;
  int iStack_140;
  int rc_1;
  size_t i;
  shared_stmt statement;
  int rc;
  char *foob;
  sqlite3 *db;
  sqlite3_stmt *stmt_ptr;
  allocator local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [48];
  long local_20;
  sqlid_t rowid_local;
  shared_connection *con_local;
  UpdateBean *this_local;
  
  local_20 = rowid;
  rowid_local = (sqlid_t)con;
  con_local = (shared_connection *)this;
  pRVar5 = curRow(this);
  lVar3 = local_20;
  if ((pRVar5->needComma & 1U) == 0) {
    std::
    stack<hiberlite::shared_res<hiberlite::RowScope>,_std::deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>_>
    ::pop(&this->rowStack);
  }
  else {
    pRVar5 = curRow(this);
    if (lVar3 != pRVar5->id) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"rowid mismatch");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0," WHERE ",&local_d1);
    std::operator+(local_b0,(char *)local_d0);
    std::operator+(local_90,(char *)local_b0);
    Transformer::toSQLiteValue_abi_cxx11_((Transformer *)&stmt_ptr,&local_20);
    std::operator+(local_70,local_90);
    std::operator+(local_50,(char *)local_70);
    pRVar5 = curRow(this);
    std::__cxx11::string::operator+=((string *)&pRVar5->query,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&stmt_ptr);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    db = (sqlite3 *)0x0;
    this_01 = shared_res<hiberlite::autoclosed_con>::operator->(con);
    db_00 = autoclosed_con::getSQLite3Ptr(this_01);
    foob = (char *)db_00;
    curRow(this);
    zSql = (char *)std::__cxx11::string::c_str();
    iVar4 = sqlite3_prepare_v2(db_00,zSql,-1,(sqlite3_stmt **)&db,(char **)&stack0xfffffffffffffef0)
    ;
    shared_res<hiberlite::autoclosed_con>::shared_res
              ((shared_res<hiberlite::autoclosed_con> *)&statement.res,con);
    database_error::database_assert(iVar4,(shared_connection *)&statement.res);
    shared_res<hiberlite::autoclosed_con>::~shared_res
              ((shared_res<hiberlite::autoclosed_con> *)&statement.res);
    psVar6 = (statement_ptr *)operator_new(8);
    statement_ptr::statement_ptr(psVar6,(sqlite3_stmt *)db);
    shared_res<hiberlite::statement_ptr>::shared_res
              ((shared_res<hiberlite::statement_ptr> *)&i,psVar6);
    _iStack_140 = 0;
    while( true ) {
      uVar2 = _iStack_140;
      pRVar5 = curRow(this);
      sVar7 = std::vector<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>::
              size(&pRVar5->atoms);
      if (sVar7 <= uVar2) break;
      pRVar5 = curRow(this);
      ppaVar8 = std::vector<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>
                ::operator[](&pRVar5->atoms,_iStack_140);
      paVar1 = *ppaVar8;
      psVar6 = shared_res<hiberlite::statement_ptr>::operator->
                         ((shared_res<hiberlite::statement_ptr> *)&i);
      psVar9 = statement_ptr::get_stmt(psVar6);
      (**paVar1->_vptr_abstract_atom)(paVar1,psVar9,(ulong)(iStack_140 + 100));
      _iStack_140 = _iStack_140 + 1;
    }
    psVar6 = shared_res<hiberlite::statement_ptr>::operator->
                       ((shared_res<hiberlite::statement_ptr> *)&i);
    psVar9 = statement_ptr::get_stmt(psVar6);
    iVar4 = sqlite3_step(psVar9);
    local_144 = iVar4;
    if (iVar4 != 0x65) {
      shared_res<hiberlite::autoclosed_con>::shared_res(&local_158,con);
      database_error::database_assert(iVar4,&local_158);
      shared_res<hiberlite::autoclosed_con>::~shared_res(&local_158);
    }
    sVar10 = std::
             stack<hiberlite::shared_res<hiberlite::RowScope>,_std::deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>_>
             ::size(&this->rowStack);
    if (sVar10 == 0) {
      this_02 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_02,"UpdateVisitor: commit row, but no row started");
      __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::
    stack<hiberlite::shared_res<hiberlite::RowScope>,_std::deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>_>
    ::pop(&this->rowStack);
    shared_res<hiberlite::statement_ptr>::~shared_res((shared_res<hiberlite::statement_ptr> *)&i);
  }
  return;
}

Assistant:

void UpdateBean::commitRow(shared_connection con, sqlid_t rowid)
{
	if(!curRow()->needComma){
		rowStack.pop();
		return;
	}
	if(rowid!=curRow()->id)
		throw std::runtime_error("rowid mismatch");
	curRow()->query+=std::string(" WHERE ")+ HIBERLITE_PRIMARY_KEY_COLUMN + "="+ Transformer::toSQLiteValue(rowid) +";";

	sqlite3_stmt* stmt_ptr=NULL;
	{
		sqlite3* db=con->getSQLite3Ptr();
		const char* foob;
		int rc=sqlite3_prepare_v2(db,curRow()->query.c_str(),-1,&stmt_ptr,&foob);
		database_error::database_assert(rc, con);
	}
	shared_stmt statement( new statement_ptr(stmt_ptr) );

	for(size_t i=0;i<curRow()->atoms.size();i++){
		curRow()->atoms[i]->bindValue(statement->get_stmt(), static_cast<int>(i)+RowScope::FirstAtom);
	}

	{
		int rc=sqlite3_step(statement->get_stmt());
		if(rc!=SQLITE_DONE)
			database_error::database_assert(rc, con);
	}


	if(!rowStack.size())
		throw std::logic_error("UpdateVisitor: commit row, but no row started");

	rowStack.pop();
}